

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

ostream * wasm::String::unescapeUTF8JSONtoWTF16(ostream *os,char *str)

{
  char cVar1;
  long lVar2;
  Fatal local_348;
  undefined1 local_1c0 [8];
  stringstream unhex;
  long local_1b0 [3];
  uint auStack_198 [89];
  uint32_t local_34;
  uint x;
  
  lVar2 = 0;
LAB_00c91ad8:
  do {
    for (; cVar1 = str[lVar2], cVar1 != '\\'; lVar2 = lVar2 + 1) {
      if (cVar1 == '\0') {
        return os;
      }
      writeWTF16CodePoint(os,(int)cVar1);
    }
    cVar1 = str[lVar2 + 1];
    switch(cVar1) {
    case 'n':
      cVar1 = '\n';
      break;
    case 'o':
    case 'p':
    case 'q':
    case 's':
      break;
    case 'r':
      cVar1 = '\r';
      break;
    case 't':
      cVar1 = '\t';
      break;
    case 'u':
      goto switchD_00c91b14_caseD_75;
    default:
      if (cVar1 == 'b') {
        cVar1 = '\b';
      }
      else if (cVar1 == 'f') {
        cVar1 = '\f';
      }
      else if (cVar1 == '\0') {
        Fatal::Fatal((Fatal *)local_1c0);
        Fatal::operator<<((Fatal *)local_1c0,(char (*) [35])"Invalid escaped JSON ends in slash");
        Fatal::~Fatal((Fatal *)local_1c0);
      }
    }
    writeWTF16CodePoint(os,(int)cVar1);
    lVar2 = lVar2 + 2;
  } while( true );
switchD_00c91b14_caseD_75:
  std::__cxx11::stringstream::stringstream((stringstream *)local_1c0);
  if ((((str[lVar2 + 2] == '\0') || (str[lVar2 + 3] == '\0')) || (str[lVar2 + 4] == '\0')) ||
     (str[lVar2 + 5] == '\0')) {
    Fatal::Fatal(&local_348);
    Fatal::operator<<(&local_348,(char (*) [28])"Invalid escaped JSON \\uXXXX");
    Fatal::~Fatal(&local_348);
  }
  *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) =
       *(uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18)) & 0xffffffb5 | 8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,str + lVar2 + 2,4);
  std::istream::_M_extract<unsigned_int>((uint *)local_1c0);
  writeWTF16CodePoint(os,local_34);
  lVar2 = lVar2 + 6;
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1c0);
  goto LAB_00c91ad8;
}

Assistant:

std::ostream& unescapeUTF8JSONtoWTF16(std::ostream& os, const char* str) {
  size_t i = 0;
  while (str[i]) {
    if (str[i] != '\\') {
      // Normal character.
      writeWTF16CodePoint(os, str[i]);
      i++;
      continue;
    }

    // Escaped character.
    char c = str[i + 1];
    if (c != 'u') {
      switch (c) {
        case 'b':
          c = '\b';
          break;
        case 'f':
          c = '\f';
          break;
        case 'n':
          c = '\n';
          break;
        case 'r':
          c = '\r';
          break;
        case 't':
          c = '\t';
          break;
        case 0:
          Fatal() << "Invalid escaped JSON ends in slash";
      }
      writeWTF16CodePoint(os, c);
      i += 2;
      continue;
    }

    // \uXXXX, 4-digit hex number. First, read the hex.
    unsigned int x;
    std::stringstream unhex;
    if (!str[i + 2] || !str[i + 3] || !str[i + 4] || !str[i + 5]) {
      Fatal() << "Invalid escaped JSON \\uXXXX";
    }
    unhex << std::hex << std::string_view(str + i + 2, 4);
    unhex >> x;

    // Write out the results.
    writeWTF16CodePoint(os, x);

    i += 6;
  }

  return os;
}